

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_string.c
# Opt level: O1

int dropt_vsnprintf(dropt_char *s,size_t n,dropt_char *format,__va_list_tag *args)

{
  int iVar1;
  
  if (format == (dropt_char *)0x0) {
    __assert_fail("format != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                  ,0x14e,
                  "int dropt_vsnprintf(dropt_char *, size_t, const dropt_char *, struct __va_list_tag *)"
                 );
  }
  iVar1 = vsnprintf(s,n,format,args);
  return iVar1;
}

Assistant:

int
dropt_vsnprintf(dropt_char* s, size_t n, const dropt_char* format, va_list args)
{
#if __STDC_VERSION__ >= 199901L || __GNUC__
    /* ISO C99-compliant.
     *
     * As far as I can tell, gcc's implementation of `vsnprintf` has always
     * matched the behavior required by the C99 standard (which is to return
     * the necessary buffer size).
     *
     * Note that this won't work with `wchar_t` because there is no true,
     * standard `wchar_t` equivalent of `snprintf`. `swprintf` comes close but
     * doesn't return the necessary buffer size (and the standard does not
     * provide a guaranteed way to test if truncation occurred), and its
     * format string can't be used interchangeably with `snprintf`.
     *
     * It's simpler not to support `wchar_t` on non-Windows platforms.
     */
    assert(format != NULL);
    return vsnprintf(s, n, format, args);
#elif defined __BORLANDC__
    /* Borland's compiler neglects to `NUL`-terminate. */
    int ret;
    assert(format != NULL);
    ret = vsnprintf(s, n, format, args);
    if (n != 0) { s[n - 1] = DROPT_TEXT_LITERAL('\0'); }
    return ret;
#elif defined _MSC_VER
    /* `_vsntprintf` and `_vsnprintf_s` on Windows don't have C99 semantics;
     * they return -1 if truncation occurs.
     */
    va_list argsCopy;
    int ret;

    assert(format != NULL);

    va_copy(argsCopy, args);
    ret = _vsctprintf(format, argsCopy);
    va_end(argsCopy);

    if (n != 0)
    {
        assert(s != NULL);

    #if _MSC_VER >= 1400
        (void) _vsntprintf_s(s, n, _TRUNCATE, format, args);
    #else
        /* This version doesn't necessarily `NUL`-terminate.  Sigh. */
        (void) _vsnprintf(s, n, format, args);
        s[n - 1] = DROPT_TEXT_LITERAL('\0');
    #endif
    }

    return ret;

#else
    #error Unsupported platform.  dropt_vsnprintf unimplemented.
    return -1;
#endif
}